

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::Matcher::Print
          (Matcher *this,DebugWriter *w,Char *input,CharCount inputLength,CharCount inputOffset,
          uint8 *instPointer,ContStack *contStack,AssertionStack *assertionStack)

{
  Program *pPVar1;
  LoopInfo *pLVar2;
  code *pcVar3;
  bool bVar4;
  Label LVar5;
  undefined4 *puVar6;
  uint *litbuf;
  Matcher *matcher;
  char16_t *form;
  long lVar7;
  ulong uVar8;
  
  DebugWriter::PrintEOL(w,L"Matcher {");
  DebugWriter::Indent(w);
  DebugWriter::Print(w,L"program:      ");
  pPVar1 = (this->program).ptr;
  DebugWriter::PrintQuotedString(w,(pPVar1->source).ptr,pPVar1->sourceLen);
  DebugWriter::EOL(w);
  DebugWriter::Print(w,L"inputPointer: ");
  if (inputLength == 0) {
    form = L"<empty input>";
  }
  else {
    if (inputLength < 0x401) {
      DebugWriter::PrintEscapedString(w,input,inputOffset);
      if (inputOffset < inputLength) {
        DebugWriter::Print(w,L"<<<");
        DebugWriter::PrintEscapedChar(w,input[inputOffset]);
        DebugWriter::Print(w,L">>>");
        DebugWriter::PrintEscapedString(w,input + inputOffset + 1,~inputOffset + inputLength);
      }
      else {
        DebugWriter::Print(w,L"<<<>>>");
      }
      DebugWriter::EOL(w);
      goto LAB_00ee714b;
    }
    form = L"<string too large>";
  }
  DebugWriter::PrintEOL(w,form);
LAB_00ee714b:
  if (((this->program).ptr)->tag < BOIInstructionsForStickyFlagTag) {
    DebugWriter::Print(w,L"instPointer: ");
    litbuf = &switchD_00ee718d::switchdataD_011adccc;
    switch(*instPointer) {
    case '\0':
      LVar5 = InstPointerToLabel(this,instPointer);
      NopInst::Print((NopInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x01':
      LVar5 = InstPointerToLabel(this,instPointer);
      FailInst::Print((FailInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x02':
      LVar5 = InstPointerToLabel(this,instPointer);
      SuccInst::Print((SuccInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x03':
      LVar5 = InstPointerToLabel(this,instPointer);
      JumpInst::Print((JumpInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x04':
      LVar5 = InstPointerToLabel(this,instPointer);
      JumpIfNotCharInst::Print((JumpIfNotCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x05':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchCharOrJumpInst::Print((MatchCharOrJumpInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x06':
      LVar5 = InstPointerToLabel(this,instPointer);
      JumpIfNotSetInst::Print((JumpIfNotSetInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\a':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchSetOrJumpInst::Print((MatchSetOrJumpInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\b':
      LVar5 = InstPointerToLabel(this,instPointer);
      Switch2Inst::Print((Switch2Inst *)instPointer,w,LVar5,
                         (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\t':
      LVar5 = InstPointerToLabel(this,instPointer);
      Switch4Inst::Print((Switch4Inst *)instPointer,w,LVar5,
                         (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\n':
      LVar5 = InstPointerToLabel(this,instPointer);
      Switch8Inst::Print((Switch8Inst *)instPointer,w,LVar5,
                         (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\v':
      LVar5 = InstPointerToLabel(this,instPointer);
      Switch16Inst::Print((Switch16Inst *)instPointer,w,LVar5,
                          (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\f':
      LVar5 = InstPointerToLabel(this,instPointer);
      Switch24Inst::Print((Switch24Inst *)instPointer,w,LVar5,
                          (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\r':
      LVar5 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume2Inst::Print
                ((SwitchAndConsume2Inst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x0e':
      LVar5 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume4Inst::Print
                ((SwitchAndConsume4Inst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x0f':
      LVar5 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume8Inst::Print
                ((SwitchAndConsume8Inst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x10':
      LVar5 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume16Inst::Print
                ((SwitchAndConsume16Inst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x11':
      LVar5 = InstPointerToLabel(this,instPointer);
      SwitchAndConsume24Inst::Print
                ((SwitchAndConsume24Inst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x12':
      LVar5 = InstPointerToLabel(this,instPointer);
      BOITestInst<true>::Print
                ((BOITestInst<true> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x13':
      LVar5 = InstPointerToLabel(this,instPointer);
      BOITestInst<false>::Print
                ((BOITestInst<false> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x14':
      LVar5 = InstPointerToLabel(this,instPointer);
      EOITestInst<true>::Print
                ((EOITestInst<true> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x15':
      LVar5 = InstPointerToLabel(this,instPointer);
      EOITestInst<false>::Print
                ((EOITestInst<false> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x16':
      LVar5 = InstPointerToLabel(this,instPointer);
      BOLTestInst::Print((BOLTestInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x17':
      LVar5 = InstPointerToLabel(this,instPointer);
      EOLTestInst::Print((EOLTestInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x18':
      LVar5 = InstPointerToLabel(this,instPointer);
      WordBoundaryTestInst<true>::Print
                ((WordBoundaryTestInst<true> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x19':
      LVar5 = InstPointerToLabel(this,instPointer);
      WordBoundaryTestInst<false>::Print
                ((WordBoundaryTestInst<false> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x1a':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchCharInst::Print((MatchCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x1b':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchChar2Inst::Print((MatchChar2Inst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x1c':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchChar3Inst::Print((MatchChar3Inst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x1d':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchChar4Inst::Print((MatchChar4Inst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\x1e':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchSetInst<false>::Print
                ((MatchSetInst<false> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\x1f':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchSetInst<true>::Print
                ((MatchSetInst<true> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ' ':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchLiteralInst::Print
                ((MatchLiteralInst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '!':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchLiteralEquivInst::Print
                ((MatchLiteralEquivInst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '\"':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchTrieInst::Print((MatchTrieInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '#':
      LVar5 = InstPointerToLabel(this,instPointer);
      OptMatchCharInst::Print((OptMatchCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '$':
      LVar5 = InstPointerToLabel(this,instPointer);
      OptMatchSetInst::Print((OptMatchSetInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '%':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToCharAndContinueInst::Print
                ((SyncToCharAndContinueInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '&':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToChar2SetAndContinueInst::Print
                ((SyncToChar2SetAndContinueInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\'':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToSetAndContinueInst<false>::Print
                ((SyncToSetAndContinueInst<false> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '(':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToSetAndContinueInst<true>::Print
                ((SyncToSetAndContinueInst<true> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ')':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::Char2LiteralScannerMixin> *)
                 instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '*':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '+':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndContinueInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ',':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer
                 ,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '-':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndContinueInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer
                 ,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '.':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToCharAndConsumeInst::Print
                ((SyncToCharAndConsumeInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '/':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToChar2SetAndConsumeInst::Print
                ((SyncToChar2SetAndConsumeInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '0':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToSetAndConsumeInst<false>::Print
                ((SyncToSetAndConsumeInst<false> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '1':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToSetAndConsumeInst<true>::Print
                ((SyncToSetAndConsumeInst<true> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '2':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::Char2LiteralScannerMixin> *)instPointer
                 ,w,LVar5,(Char *)litbuf);
      break;
    case '3':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '4':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndConsumeInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '5':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer,
                 w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '6':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndConsumeInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer,
                 w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '7':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToCharAndBackupInst::Print((SyncToCharAndBackupInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '8':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToSetAndBackupInst<false>::Print
                ((SyncToSetAndBackupInst<false> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '9':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToSetAndBackupInst<true>::Print
                ((SyncToSetAndBackupInst<true> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case ':':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::Char2LiteralScannerMixin> *)instPointer,
                 w,LVar5,(Char *)litbuf);
      break;
    case ';':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
      ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMoore<char16_t>_>_>
               *)instPointer,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '<':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
      ::Print((SyncToLiteralAndBackupInstT<UnifiedRegex::ScannerMixinT<UnifiedRegex::TextbookBoyerMooreWithLinearMap<char16_t>_>_>
               *)instPointer,w,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '=':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<4U>_> *)instPointer,w
                 ,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '>':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_>::Print
                ((SyncToLiteralAndBackupInstT<UnifiedRegex::EquivScannerMixinT<1U>_> *)instPointer,w
                 ,LVar5,(((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '?':
      LVar5 = InstPointerToLabel(this,instPointer);
      SyncToLiteralsAndBackupInst::Print
                ((SyncToLiteralsAndBackupInst *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case '@':
      LVar5 = InstPointerToLabel(this,instPointer);
      MatchGroupInst::Print((MatchGroupInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'A':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginDefineGroupInst::Print((BeginDefineGroupInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'B':
      LVar5 = InstPointerToLabel(this,instPointer);
      EndDefineGroupInst::Print((EndDefineGroupInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'C':
      LVar5 = InstPointerToLabel(this,instPointer);
      DefineGroupFixedInst::Print((DefineGroupFixedInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'D':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginLoopInst::Print((BeginLoopInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'E':
      LVar5 = InstPointerToLabel(this,instPointer);
      RepeatLoopInst::Print((RepeatLoopInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'F':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginLoopIfCharInst::Print((BeginLoopIfCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'G':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginLoopIfSetInst::Print((BeginLoopIfSetInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'H':
      LVar5 = InstPointerToLabel(this,instPointer);
      RepeatLoopIfCharInst::Print((RepeatLoopIfCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'I':
      LVar5 = InstPointerToLabel(this,instPointer);
      RepeatLoopIfSetInst::Print((RepeatLoopIfSetInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'J':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginLoopFixedInst::Print((BeginLoopFixedInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'K':
      LVar5 = InstPointerToLabel(this,instPointer);
      RepeatLoopFixedInst::Print((RepeatLoopFixedInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'L':
      LVar5 = InstPointerToLabel(this,instPointer);
      LoopSetInst::Print((LoopSetInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'M':
      LVar5 = InstPointerToLabel(this,instPointer);
      LoopSetWithFollowFirstInst::Print
                ((LoopSetWithFollowFirstInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'N':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginLoopFixedGroupLastIterationInst::Print
                ((BeginLoopFixedGroupLastIterationInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'O':
      LVar5 = InstPointerToLabel(this,instPointer);
      RepeatLoopFixedGroupLastIterationInst::Print
                ((RepeatLoopFixedGroupLastIterationInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'P':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginGreedyLoopNoBacktrackInst::Print
                ((BeginGreedyLoopNoBacktrackInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'Q':
      LVar5 = InstPointerToLabel(this,instPointer);
      RepeatGreedyLoopNoBacktrackInst::Print
                ((RepeatGreedyLoopNoBacktrackInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'R':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompCharInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompCharInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'S':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompCharInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompCharInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'T':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompSetInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'U':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompSetInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompSetInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'V':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompCharGroupInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompCharGroupInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'W':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompCharGroupInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompCharGroupInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'X':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompSetGroupInst<(UnifiedRegex::ChompMode)0>::Print
                ((ChompSetGroupInst<(UnifiedRegex::ChompMode)0> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'Y':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompSetGroupInst<(UnifiedRegex::ChompMode)1>::Print
                ((ChompSetGroupInst<(UnifiedRegex::ChompMode)1> *)instPointer,w,LVar5,
                 (((this->program).ptr)->rep).insts.litbuf.ptr);
      break;
    case 'Z':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompCharBoundedInst::Print((ChompCharBoundedInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '[':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompSetBoundedInst::Print((ChompSetBoundedInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '\\':
      LVar5 = InstPointerToLabel(this,instPointer);
      ChompSetBoundedGroupLastCharInst::Print
                ((ChompSetBoundedGroupLastCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case ']':
      LVar5 = InstPointerToLabel(this,instPointer);
      TryInst::Print((TryInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '^':
      LVar5 = InstPointerToLabel(this,instPointer);
      TryIfCharInst::Print((TryIfCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '_':
      LVar5 = InstPointerToLabel(this,instPointer);
      TryMatchCharInst::Print((TryMatchCharInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case '`':
      LVar5 = InstPointerToLabel(this,instPointer);
      TryIfSetInst::Print((TryIfSetInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'a':
      LVar5 = InstPointerToLabel(this,instPointer);
      TryMatchSetInst::Print((TryMatchSetInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'b':
      LVar5 = InstPointerToLabel(this,instPointer);
      BeginAssertionInst::Print((BeginAssertionInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    case 'c':
      LVar5 = InstPointerToLabel(this,instPointer);
      EndAssertionInst::Print((EndAssertionInst *)instPointer,w,LVar5,(Char *)litbuf);
      break;
    default:
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar4 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexRuntime.cpp"
                         ,0x15f1,"(false)","false");
      if (!bVar4) {
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar6 = 0;
    }
    DebugWriter::PrintEOL(w,L"groups:");
    DebugWriter::Indent(w);
    if (((this->program).ptr)->numGroups != 0) {
      lVar7 = 0;
      uVar8 = 0;
      do {
        DebugWriter::Print(w,L"%d: ",uVar8 & 0xffffffff);
        GroupInfo::Print((GroupInfo *)((long)&((this->groupInfos).ptr)->offset + lVar7),w,input);
        DebugWriter::EOL(w);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 8;
      } while (uVar8 < ((this->program).ptr)->numGroups);
    }
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"loops:");
    DebugWriter::Indent(w);
    if (0 < ((this->program).ptr)->numLoops) {
      lVar7 = 4;
      uVar8 = 0;
      do {
        DebugWriter::Print(w,L"%d: ",uVar8 & 0xffffffff);
        pLVar2 = (this->loopInfos).ptr;
        DebugWriter::Print(w,L"number: %u, startInputOffset: %u",
                           (ulong)*(uint *)((long)pLVar2 + lVar7 + -4),
                           (ulong)*(uint *)((long)&pLVar2->number + lVar7));
        DebugWriter::EOL(w);
        uVar8 = uVar8 + 1;
        lVar7 = lVar7 + 0x10;
      } while ((long)uVar8 < (long)((this->program).ptr)->numLoops);
    }
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"contStack: (top to bottom)");
    DebugWriter::Indent(w);
    ContStack::Print(contStack,w,input);
    DebugWriter::Unindent(w);
    DebugWriter::PrintEOL(w,L"assertionStack: (top to bottom)");
    DebugWriter::Indent(w);
    AssertionStack::Print(assertionStack,w,matcher);
    DebugWriter::Unindent(w);
  }
  DebugWriter::Unindent(w);
  DebugWriter::PrintEOL(w,L"}");
  DebugWriter::Flush(w);
  return;
}

Assistant:

void Matcher::Print(DebugWriter* w, const Char* const input, const CharCount inputLength, CharCount inputOffset, const uint8* instPointer, ContStack &contStack, AssertionStack &assertionStack) const
    {
        w->PrintEOL(_u("Matcher {"));
        w->Indent();
        w->Print(_u("program:      "));
        w->PrintQuotedString(program->source, program->sourceLen);
        w->EOL();
        w->Print(_u("inputPointer: "));
        if (inputLength == 0)
        {
            w->PrintEOL(_u("<empty input>"));
        }
        else if (inputLength > 1024)
        {
            w->PrintEOL(_u("<string too large>"));
        }
        else
        {
            w->PrintEscapedString(input, inputOffset);
            if (inputOffset >= inputLength)
            {
                w->Print(_u("<<<>>>"));
            }
            else
            {
                w->Print(_u("<<<"));
                w->PrintEscapedChar(input[inputOffset]);
                w->Print(_u(">>>"));
                w->PrintEscapedString(input + inputOffset + 1, inputLength - inputOffset - 1);
            }
            w->EOL();
        }
        if (program->tag == Program::ProgramTag::BOIInstructionsTag || program->tag == Program::ProgramTag::InstructionsTag)
        {
            w->Print(_u("instPointer: "));

            const Inst* inst = (const Inst*)instPointer;
            switch (inst->tag)
            {
#define MBase(TagName, ClassName) \
            case Inst::InstTag::TagName: \
            { \
                const ClassName *actualInst = static_cast<const ClassName *>(inst); \
                actualInst->Print(w, InstPointerToLabel(instPointer), program->rep.insts.litbuf); \
                break; \
            }
#define M(TagName) MBase(TagName, TagName##Inst)
#define MTemplate(TagName, TemplateDeclaration, GenericClassName, SpecializedClassName) MBase(TagName, SpecializedClassName)
#include "RegexOpCodes.h"
#undef MBase
#undef M
#undef MTemplate
            default:
                Assert(false);
                __assume(false);
            }

            w->PrintEOL(_u("groups:"));
            w->Indent();
            for (int i = 0; i < program->numGroups; i++)
            {
                w->Print(_u("%d: "), i);
                groupInfos[i].Print(w, input);
                w->EOL();
            }
            w->Unindent();
            w->PrintEOL(_u("loops:"));
            w->Indent();
            for (int i = 0; i < program->numLoops; i++)
            {
                w->Print(_u("%d: "), i);
                loopInfos[i].Print(w);
                w->EOL();
            }
            w->Unindent();
            w->PrintEOL(_u("contStack: (top to bottom)"));
            w->Indent();
            contStack.Print(w, input);
            w->Unindent();
            w->PrintEOL(_u("assertionStack: (top to bottom)"));
            w->Indent();
            assertionStack.Print(w, this);
            w->Unindent();
        }
        w->Unindent();
        w->PrintEOL(_u("}"));
        w->Flush();
    }